

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.hh
# Opt level: O1

void __thiscall ActionMergeAdjacent::ActionMergeAdjacent(ActionMergeAdjacent *this,string *g)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"mergeadjacent","");
  Action::Action(&this->super_Action,8,&local_40,g);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_Action)._vptr_Action = (_func_int **)&PTR__Action_003c9b30;
  return;
}

Assistant:

ActionMergeAdjacent(const string &g) : Action(rule_onceperfunc,"mergeadjacent",g) {}